

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O3

bool __thiscall Indexing::CodeTree::Matcher::prepareLiteral(Matcher *this)

{
  ulong uVar1;
  ulong uVar2;
  LitInfo *pLVar3;
  
  uVar1 = this->linfoCnt;
  uVar2 = this->curLInfo;
  if (uVar2 < uVar1) {
    (this->super_BaseMatcher).tp = 0;
    pLVar3 = this->linfos;
    (this->super_BaseMatcher).op = this->entry;
    (this->super_BaseMatcher).ft = pLVar3[uVar2].ft;
  }
  return uVar2 < uVar1;
}

Assistant:

bool CodeTree::Matcher::prepareLiteral()
{
  if(curLInfo>=linfoCnt) {
    return false;
  }
  tp=0;
  op=entry;
  ft=linfos[curLInfo].ft;
  return true;
}